

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Module.c
# Opt level: O0

cs_err option(cs_struct *handle,cs_opt_type type,size_t value)

{
  size_t value_local;
  cs_opt_type type_local;
  cs_struct *handle_local;
  
  return CS_ERR_OK;
}

Assistant:

static cs_err option(cs_struct *handle, cs_opt_type type, size_t value)
{
	switch(type) {
		default:
			break;
		case CS_OPT_MODE:
			if (value == CS_MODE_64)
				handle->regsize_map = regsize_map_64;
			else
				handle->regsize_map = regsize_map_32;

			handle->mode = value;
			break;
		case CS_OPT_SYNTAX:
			switch(value) {
				default:
					// wrong syntax value
					handle->errnum = CS_ERR_OPTION;
					return CS_ERR_OPTION;

				case CS_OPT_SYNTAX_DEFAULT:
				case CS_OPT_SYNTAX_INTEL:
					handle->printer = X86_Intel_printInst;
					handle->syntax = CS_OPT_SYNTAX_INTEL;
					break;

				case CS_OPT_SYNTAX_ATT:
#if !defined(CAPSTONE_DIET) && !defined(CAPSTONE_X86_ATT_DISABLE)
					handle->printer = X86_ATT_printInst;
					handle->syntax = CS_OPT_SYNTAX_ATT;
					break;
#elif !defined(CAPSTONE_DIET) && defined(CAPSTONE_X86_ATT_DISABLE)
					// ATT syntax is unsupported
					handle->errnum = CS_ERR_X86_ATT;
					return CS_ERR_X86_ATT;
#else	// CAPSTONE_DIET
					// this is irrelevant in CAPSTONE_DIET mode
					handle->errnum = CS_ERR_DIET;
					return CS_ERR_DIET;
#endif
			}
			break;
	}

	return CS_ERR_OK;
}